

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ReadWriteMemTask::checkArguments
          (ReadWriteMemTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  Diagnostic *this_00;
  Expression *arg;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,2,4);
  if (!bVar2) {
LAB_00486898:
    return pCVar1->errorType;
  }
  bVar2 = Type::canBeStringLike(((*args->_M_ptr)->type).ptr);
  if (bVar2) {
    bVar2 = Type::isUnpackedArray((args->_M_ptr[1]->type).ptr);
    arg = args->_M_ptr[1];
    if (bVar2) {
      pTVar4 = (arg->type).ptr;
      do {
        pTVar3 = pTVar4->canonical;
        if (pTVar3 == (Type *)0x0) {
          Type::resolveCanonical(pTVar4);
          pTVar3 = pTVar4->canonical;
        }
        if ((((pTVar3->super_Symbol).kind == AssociativeArrayType) &&
            (pTVar3 = Type::getAssociativeIndexType(pTVar4), pTVar3 != (Type *)0x0)) &&
           (bVar2 = Type::isIntegral(pTVar3), !bVar2)) {
          this_00 = ASTContext::addDiag(context,(DiagCode)0x1f000b,args->_M_ptr[1]->sourceRange);
          Diagnostic::operator<<(this_00,&(this->super_SystemTaskBase).super_SystemSubroutine.name);
          goto LAB_00486898;
        }
        pTVar4 = Type::getArrayElementType(pTVar4);
        bVar2 = Type::isUnpackedArray(pTVar4);
      } while (bVar2);
      bVar2 = Type::isIntegral(pTVar4);
      if (bVar2) {
        if ((args->_M_extent)._M_extent_value < 3) {
LAB_00486844:
          return pCVar1->voidType;
        }
        bVar2 = Type::isNumeric((args->_M_ptr[2]->type).ptr);
        if (bVar2) {
          if (((args->_M_extent)._M_extent_value != 4) ||
             (bVar2 = Type::isNumeric((args->_M_ptr[3]->type).ptr), bVar2)) goto LAB_00486844;
          arg = args->_M_ptr[3];
        }
        else {
          arg = args->_M_ptr[2];
        }
      }
      else {
        arg = args->_M_ptr[1];
      }
    }
  }
  else {
    arg = *args->_M_ptr;
  }
  pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 4))
            return comp.getErrorType();

        if (!args[0]->type->canBeStringLike())
            return badArg(context, *args[0]);

        if (!args[1]->type->isUnpackedArray())
            return badArg(context, *args[1]);

        const Type* t = args[1]->type;
        do {
            if (t->isAssociativeArray()) {
                auto indexType = t->getAssociativeIndexType();
                if (indexType && !indexType->isIntegral()) {
                    context.addDiag(diag::QueryOnAssociativeNonIntegral, args[1]->sourceRange)
                        << name;
                    return comp.getErrorType();
                }
            }
            t = t->getArrayElementType();
        } while (t->isUnpackedArray());

        if (!t->isIntegral())
            return badArg(context, *args[1]);

        if (args.size() >= 3) {
            if (!args[2]->type->isNumeric())
                return badArg(context, *args[2]);

            if (args.size() == 4) {
                if (!args[3]->type->isNumeric())
                    return badArg(context, *args[3]);
            }
        }

        return comp.getVoidType();
    }